

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::OnTestEnd(StreamingListener *this,TestInfo *test_info)

{
  bool bVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  undefined8 uVar10;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  string local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  TimeInMillis local_38;
  
  bVar1 = TestResult::Skipped(&test_info->result_);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = TestResult::Failed(&test_info->result_);
    bVar1 = !bVar1;
  }
  pcVar8 = "0";
  if (bVar1) {
    pcVar8 = "1";
  }
  local_78[0] = local_68;
  pcVar7 = "";
  if (bVar1) {
    pcVar7 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar8,pcVar7);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x130b1a);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_88 = *plVar4;
    lStack_80 = plVar2[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar4;
    local_98 = (long *)*plVar2;
  }
  local_90 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_c8 = *puVar5;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar5;
    local_d8 = (ulong *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_38 = (test_info->result_).elapsed_time_;
  StreamableToString<long_long>(&local_b8,&local_38);
  uVar9 = 0xf;
  if (local_d8 != &local_c8) {
    uVar9 = local_c8;
  }
  if (uVar9 < local_b8._M_string_length + local_d0) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar10 = local_b8.field_2._M_allocated_capacity;
    }
    if (local_b8._M_string_length + local_d0 <= (ulong)uVar10) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8);
      goto LAB_00129171;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8._M_dataplus._M_p);
LAB_00129171:
  local_f8 = &local_e8;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_e8 = *plVar2;
    uStack_e0 = puVar3[3];
  }
  else {
    local_e8 = *plVar2;
    local_f8 = (long *)*puVar3;
  }
  local_f0 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar6 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_58.field_2._M_allocated_capacity = *psVar6;
    local_58.field_2._8_8_ = plVar2[3];
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar6;
    local_58._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_58._M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  AbstractSocketWriter::SendLn
            ((this->socket_writer_)._M_t.
             super___uniq_ptr_impl<testing::internal::StreamingListener::AbstractSocketWriter,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
             .
             super__Head_base<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_false>
             ._M_head_impl,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return;
}

Assistant:

void OnTestEnd(const TestInfo& test_info) override {
    SendLn("event=TestEnd&passed=" +
           FormatBool((test_info.result())->Passed()) +
           "&elapsed_time=" +
           StreamableToString((test_info.result())->elapsed_time()) + "ms");
  }